

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O1

string * StringBuilder<char[7],std::__cxx11::string&>
                   (string *__return_storage_ptr__,char (*arg) [7],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  std::__cxx11::string::string((string *)&local_38,*arg,(allocator *)&local_58);
  pcVar2 = (args->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + args->_M_string_length);
  uVar5 = 0xf;
  if (local_38 != local_28) {
    uVar5 = local_28[0];
  }
  if (uVar5 < (ulong)(local_50 + local_30)) {
    uVar5 = 0xf;
    if (local_58 != local_48) {
      uVar5 = local_48[0];
    }
    if ((ulong)(local_50 + local_30) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
      goto LAB_0011d830;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_0011d830:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar3 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}